

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  pointer pbVar1;
  bool bVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  ulong uVar4;
  ostream *poVar5;
  char *(*extraout_RDX) [8];
  char *(*extraout_RDX_00) [8];
  char *(*extraout_RDX_01) [8];
  char *(*array) [8];
  long lVar6;
  undefined1 *this;
  size_t i;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string local_b8 [32];
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  allocator<char> local_41;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,(test_property->key_)._M_dataplus._M_p,&local_41);
  bVar2 = std::operator==(xml_element,"testsuites");
  if (bVar2) {
    this = kReservedTestSuitesAttributes;
    array = extraout_RDX;
  }
  else {
    bVar2 = std::operator==(xml_element,"testsuite");
    if (bVar2) {
      this = kReservedTestSuiteAttributes;
      array = extraout_RDX_00;
    }
    else {
      bVar2 = std::operator==(xml_element,"testcase");
      if (!bVar2) {
        internal::GTestLog::GTestLog
                  ((GTestLog *)&local_98,GTEST_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest.cc"
                   ,0x913);
        poVar5 = std::operator<<((ostream *)&std::cerr,"Condition false failed. ");
        poVar5 = std::operator<<(poVar5,"Unrecognized xml_element provided: ");
        std::operator<<(poVar5,(string *)xml_element);
        internal::GTestLog::~GTestLog((GTestLog *)&local_98);
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        goto LAB_0013dd17;
      }
      this = kReservedTestCaseAttributes;
      array = extraout_RDX_01;
    }
  }
  ArrayAsVector<8ul>(&local_68,(testing *)this,array);
LAB_0013dd17:
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_b8);
  pbVar1 = local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message((Message *)&local_40);
    std::operator<<((ostream *)&(local_40._M_head_impl)->field_0x10,
                    "Reserved key used in RecordProperty(): ");
    std::operator<<((ostream *)&(local_40._M_head_impl)->field_0x10,local_b8);
    std::operator<<((ostream *)&(local_40._M_head_impl)->field_0x10," (");
    local_70 = pbVar1;
    local_78 = _Var3._M_current;
    Message::Message((Message *)&local_38);
    lVar6 = 0;
    for (uVar7 = 0;
        uVar4 = (long)local_68.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5, uVar7 < uVar4;
        uVar7 = uVar7 + 1) {
      if ((uVar7 != 0) && (2 < uVar4)) {
        std::operator<<((ostream *)&(local_38._M_head_impl)->field_0x10,", ");
        uVar4 = (long)local_68.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      if (uVar7 == uVar4 - 1) {
        std::operator<<((ostream *)&(local_38._M_head_impl)->field_0x10,"and ");
      }
      std::operator<<((ostream *)&(local_38._M_head_impl)->field_0x10,"\'");
      std::operator<<((ostream *)&(local_38._M_head_impl)->field_0x10,
                      (string *)
                      ((long)&((local_68.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar6));
      std::operator<<((ostream *)&(local_38._M_head_impl)->field_0x10,"\'");
      lVar6 = lVar6 + 0x20;
    }
    internal::StringStreamToString(&local_98,local_38._M_head_impl);
    pbVar8 = local_70;
    _Var3._M_current = local_78;
    if (local_38._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    std::operator<<((ostream *)&(local_40._M_head_impl)->field_0x10,(string *)&local_98);
    std::operator<<((ostream *)&(local_40._M_head_impl)->field_0x10," are reserved by ");
    std::operator<<((ostream *)&(local_40._M_head_impl)->field_0x10,"Google Test");
    std::operator<<((ostream *)&(local_40._M_head_impl)->field_0x10,")");
    internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest.cc"
               ,0x93c,"Failed");
    internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_40);
    internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    std::__cxx11::string::~string((string *)&local_98);
    if (local_40._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::__cxx11::string::~string(local_b8);
  return _Var3._M_current == pbVar8;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}